

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.cc
# Opt level: O0

void google::protobuf::Base64EscapeInternal
               (uchar *src,int szsrc,string *dest,bool do_padding,char *base64_chars)

{
  int iVar1;
  byte in_CL;
  ulong in_RDX;
  int in_ESI;
  char *in_RDI;
  int unaff_retaddr;
  char *in_stack_00000008;
  int in_stack_00000014;
  uchar *in_stack_00000018;
  int escaped_len;
  int calc_escaped_size;
  string *in_stack_ffffffffffffff60;
  undefined1 do_padding_00;
  
  CalculateBase64EscapedLen(in_ESI,(bool)(in_CL & 1));
  do_padding_00 = (undefined1)((uint)in_ESI >> 0x18);
  std::__cxx11::string::resize(in_RDX);
  string_as_array(in_stack_ffffffffffffff60);
  std::__cxx11::string::size();
  iVar1 = Base64EscapeInternal
                    (in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,in_RDI,
                     (bool)do_padding_00);
  std::__cxx11::string::erase(in_RDX,(long)iVar1);
  return;
}

Assistant:

void Base64EscapeInternal(const unsigned char* src, int szsrc,
                          string* dest, bool do_padding,
                          const char* base64_chars) {
  const int calc_escaped_size =
    CalculateBase64EscapedLen(szsrc, do_padding);
  dest->resize(calc_escaped_size);
  const int escaped_len = Base64EscapeInternal(src, szsrc,
                                               string_as_array(dest),
                                               dest->size(),
                                               base64_chars,
                                               do_padding);
  GOOGLE_DCHECK_EQ(calc_escaped_size, escaped_len);
  dest->erase(escaped_len);
}